

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::setBackgroundBrush(QGraphicsScene *this,QBrush *brush)

{
  bool bVar1;
  QGraphicsScenePrivate *pQVar2;
  const_iterator o;
  QBrush *in_RSI;
  QGraphicsView *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view;
  add_const_t<QList<QGraphicsView_*>_> *__range1;
  QGraphicsScenePrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QWidget *in_stack_ffffffffffffff88;
  QRectF *in_stack_ffffffffffffffd0;
  QGraphicsScene *in_stack_ffffffffffffffd8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsScene *)0x9cd44f);
  QBrush::operator=(&pQVar2->backgroundBrush,in_RSI);
  local_10.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QGraphicsView_*>::begin((QList<QGraphicsView_*> *)in_RDI);
  o = QList<QGraphicsView_*>::end((QList<QGraphicsView_*> *)in_RDI);
  while( true ) {
    bVar1 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<QGraphicsView_*>::const_iterator::operator*(&local_10);
    QGraphicsView::resetCachedContent(in_RDI);
    QAbstractScrollArea::viewport(&in_RDI->super_QAbstractScrollArea);
    QWidget::update(in_stack_ffffffffffffff88);
    QList<QGraphicsView_*>::const_iterator::operator++(&local_10);
  }
  QRectF::QRectF((QRectF *)&stack0xffffffffffffffc0);
  update(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::setBackgroundBrush(const QBrush &brush)
{
    Q_D(QGraphicsScene);
    d->backgroundBrush = brush;
    for (QGraphicsView *view : std::as_const(d->views)) {
        view->resetCachedContent();
        view->viewport()->update();
    }
    update();
}